

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O1

void ndiTransformToMatrixfd(float *trans,double *matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  
  fVar1 = *trans;
  fVar2 = trans[1];
  fVar3 = trans[2];
  fVar4 = trans[3];
  dVar6 = (double)(fVar2 * fVar2) + (double)(fVar3 * fVar3) + (double)(fVar4 * fVar4);
  dVar5 = ((double)(fVar1 * fVar1) - dVar6) * 0.5;
  dVar6 = 2.0 / (dVar6 + (double)(fVar1 * fVar1));
  *matrix = ((double)(fVar2 * fVar2) + dVar5) * dVar6;
  matrix[1] = ((double)(fVar2 * fVar3) + (double)(fVar1 * fVar4)) * dVar6;
  matrix[2] = ((double)(fVar2 * fVar4) - (double)(fVar1 * fVar3)) * dVar6;
  matrix[3] = 0.0;
  matrix[4] = ((double)(fVar2 * fVar3) - (double)(fVar1 * fVar4)) * dVar6;
  matrix[5] = ((double)(fVar3 * fVar3) + dVar5) * dVar6;
  matrix[6] = ((double)(fVar1 * fVar2) + (double)(fVar3 * fVar4)) * dVar6;
  matrix[7] = 0.0;
  matrix[8] = ((double)(fVar1 * fVar3) + (double)(fVar2 * fVar4)) * dVar6;
  matrix[9] = ((double)(fVar3 * fVar4) - (double)(fVar1 * fVar2)) * dVar6;
  matrix[10] = (dVar5 + (double)(fVar4 * fVar4)) * dVar6;
  matrix[0xb] = 0.0;
  matrix[0xc] = (double)trans[4];
  matrix[0xd] = (double)trans[5];
  matrix[0xe] = (double)trans[6];
  matrix[0xf] = 1.0;
  return;
}

Assistant:

ndicapiExport void ndiTransformToMatrixfd(const float trans[8], double matrix[16])
{
  double ww, xx, yy, zz, wx, wy, wz, xy, xz, yz, ss, rr, f;

  /* Determine some calculations done more than once. */
  ww = trans[0] * trans[0];
  xx = trans[1] * trans[1];
  yy = trans[2] * trans[2];
  zz = trans[3] * trans[3];
  wx = trans[0] * trans[1];
  wy = trans[0] * trans[2];
  wz = trans[0] * trans[3];
  xy = trans[1] * trans[2];
  xz = trans[1] * trans[3];
  yz = trans[2] * trans[3];

  rr = xx + yy + zz;
  ss = (ww - rr) * 0.5;
  /* Normalization factor */
  f = 2.0 / (ww + rr);

  /* Fill in the matrix. */
  matrix[0]  = (ss + xx) * f;
  matrix[1]  = (wz + xy) * f;
  matrix[2]  = (-wy + xz) * f;
  matrix[3]  = 0;
  matrix[4]  = (-wz + xy) * f;
  matrix[5]  = (ss + yy) * f;
  matrix[6]  = (wx + yz) * f;
  matrix[7]  = 0;
  matrix[8]  = (wy + xz) * f;
  matrix[9]  = (-wx + yz) * f;
  matrix[10] = (ss + zz) * f;
  matrix[11] = 0;
  matrix[12] = trans[4];
  matrix[13] = trans[5];
  matrix[14] = trans[6];
  matrix[15] = 1;
}